

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O2

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::funcFromModel
          (LLVMReadWriteGraphBuilder *this,FunctionModel *model,CallInst *CInst)

{
  LLVMPointsToSetImpl *pLVar1;
  type tVar2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  RWNode *this_00;
  raw_ostream *prVar6;
  RWNode *target;
  Operand *pOVar7;
  long lVar8;
  Offset OVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  pair<dg::Offset,_dg::Offset> pVar12;
  const_iterator __begin3;
  Offset local_90;
  Offset local_88;
  undefined1 local_80 [8];
  Offset local_78;
  LLVMReadWriteGraphBuilder *local_70;
  ulong local_68;
  char local_60 [8];
  LLVMPointsToSetImpl *local_58;
  type local_50;
  CallInst *local_48;
  FunctionModel *local_40;
  const_iterator __end3;
  
  local_70 = this;
  this_00 = ReadWriteGraph::create(&this->graph,GENERIC);
  local_50 = Offset::UNKNOWN;
  uVar10 = 0;
  local_48 = CInst;
  local_40 = model;
  do {
    uVar5 = llvm::CallBase::arg_size((CallBase *)CInst);
    if (uVar5 <= uVar10) {
      return this_00;
    }
    bVar3 = FunctionModel::handles(model,(uint)uVar10);
    if (bVar3) {
      (**(code **)(*(long *)local_70->PTA + 0x10))
                (local_60,local_70->PTA,
                 *(undefined8 *)
                  ((CallBase *)CInst +
                  (uVar10 * 0x20 - (ulong)(uint)(*(int *)((CallBase *)CInst + 0x14) << 5))));
      pLVar1 = local_58;
      if (local_60[0] == '\0') {
        prVar6 = (raw_ostream *)llvm::errs();
        llvm::raw_ostream::operator<<
                  (prVar6,"[Warning]: did not find pt-set for modeled function\n");
        prVar6 = (raw_ostream *)llvm::errs();
        prVar6 = llvm::raw_ostream::operator<<(prVar6,"           Func: ");
        prVar6 = llvm::raw_ostream::operator<<(prVar6,&model->name);
        prVar6 = llvm::raw_ostream::operator<<(prVar6,", operand ");
        prVar6 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar6,uVar10);
        llvm::raw_ostream::operator<<(prVar6,"\n");
      }
      else {
        if (local_58 == (LLVMPointsToSetImpl *)0x0) {
          __begin3.impl = (LLVMPointsToSetImpl *)0x0;
        }
        else {
          cVar4 = (**(code **)(*(long *)local_58 + 0x38))(local_58);
          __begin3.impl = (LLVMPointsToSetImpl *)0x0;
          if (cVar4 == '\0') {
            __begin3.impl = pLVar1;
          }
        }
        __end3.impl = (LLVMPointsToSetImpl *)0x0;
        local_68 = uVar10;
        while( true ) {
          bVar3 = LLVMPointsToSet::const_iterator::operator!=(&__begin3,&__end3);
          if (!bVar3) break;
          auVar11 = (**(code **)(*(long *)__begin3.impl + 0x48))();
          _local_80 = auVar11;
          if (auVar11._0_8_[0x10] != (Value)0x0) {
            target = getOperand(local_70,auVar11._0_8_);
            pOVar7 = FunctionModel::defines(model,(uint)uVar10);
            if (pOVar7 != (Operand *)0x0) {
              pVar12 = getFromTo<dg::FunctionModel::Operand_const*>(CInst,pOVar7);
              lVar8 = (**(code **)(*(long *)local_58 + 0x20))();
              tVar2 = local_50;
              bVar3 = false;
              if ((lVar8 == 1) && (bVar3 = false, local_78.offset != local_50)) {
                OVar9 = Offset::operator+(&local_78,pVar12.first.offset);
                if (OVar9.offset != tVar2) {
                  OVar9 = Offset::operator+(&local_78,pVar12.second.offset);
                  if (OVar9.offset != tVar2) {
                    bVar3 = *(char *)((long)local_80 + 0x10) != 'S';
                    goto LAB_00123a8c;
                  }
                }
                bVar3 = false;
              }
LAB_00123a8c:
              local_88 = Offset::operator+(&local_78,pVar12.first.offset);
              local_90 = Offset::operator+(&local_78,pVar12.second.offset);
              RWNode::addDef(this_00,target,&local_88,&local_90,bVar3);
              uVar10 = local_68;
              model = local_40;
              CInst = local_48;
            }
            pOVar7 = FunctionModel::uses(model,(uint)uVar10);
            if (pOVar7 != (Operand *)0x0) {
              pVar12 = getFromTo<dg::FunctionModel::Operand_const*>(CInst,pOVar7);
              local_88 = Offset::operator+(&local_78,pVar12.first.offset);
              uVar10 = local_68;
              local_90 = Offset::operator+(&local_78,pVar12.second.offset);
              RWNode::addUse(this_00,target,&local_88,&local_90);
            }
          }
          LLVMPointsToSet::const_iterator::operator++(&__begin3);
        }
      }
      if (local_58 != (LLVMPointsToSetImpl *)0x0) {
        (**(code **)(*(long *)local_58 + 0x58))();
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::funcFromModel(const FunctionModel *model,
                                                 const llvm::CallInst *CInst) {
    RWNode *node = &create(RWNodeType::GENERIC);

    for (unsigned int i = 0; i < llvmutils::getNumArgOperands(CInst); ++i) {
        if (!model->handles(i))
            continue;

        auto *const llvmOp = CInst->getArgOperand(i);
        auto pts = PTA->getLLVMPointsToChecked(llvmOp);
        // if we do not have a pts, this is not pointer
        // relevant instruction. We must do it this way
        // instead of type checking, due to the inttoptr.
        if (!pts.first) {
            llvm::errs()
                    << "[Warning]: did not find pt-set for modeled function\n";
            llvm::errs() << "           Func: " << model->name << ", operand "
                         << i << "\n";
            continue;
        }

        for (const auto &ptr : pts.second) {
            if (llvm::isa<llvm::Function>(ptr.value))
                // functions may not be redefined
                continue;

            RWNode *target = getOperand(ptr.value);
            assert(target && "Don't have pointer target for call argument");

            Offset from, to;
            if (const auto *defines = model->defines(i)) {
                std::tie(from, to) = getFromTo(CInst, defines);
                // this call may define this memory
                bool strong_updt = pts.second.size() == 1 &&
                                   !ptr.offset.isUnknown() &&
                                   !(ptr.offset + from).isUnknown() &&
                                   !(ptr.offset + to).isUnknown() &&
                                   !llvm::isa<llvm::CallInst>(ptr.value);
                // FIXME: what about vars in recursive functions?
                node->addDef(target, ptr.offset + from, ptr.offset + to,
                             strong_updt);
            }
            if (const auto *uses = model->uses(i)) {
                std::tie(from, to) = getFromTo(CInst, uses);
                // this call uses this memory
                node->addUse(target, ptr.offset + from, ptr.offset + to);
            }
        }
    }

    return node;
}